

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_meshb_cell(REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_LONG nnode,
                   REF_INT version,REF_BOOL pad,FILE *file)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  int local_238;
  int local_1e8;
  int local_198;
  int local_174;
  int local_170;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_INT ref_malloc_init_i_1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_GLOB n4;
  REF_GLOB n3;
  REF_GLOB n2;
  REF_GLOB n1;
  REF_GLOB n0;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  size_t sStack_c0;
  REF_INT zero;
  size_t nread;
  REF_INT new_location;
  REF_INT ncell_keep;
  REF_INT node;
  REF_INT part;
  REF_INT cell;
  REF_INT section_size;
  REF_INT size_per;
  REF_INT node_per;
  REF_INT *start_to_send;
  REF_INT *elements_to_send;
  REF_INT *sent_part;
  REF_INT *dest;
  REF_GLOB *sent_c2n;
  REF_LONG *c2n_long;
  REF_INT *c2n_int;
  REF_GLOB *c2n;
  int local_50;
  REF_INT elements_to_receive;
  REF_INT end_of_message;
  REF_INT chunk;
  REF_LONG ncell_read;
  REF_MPI ref_mpi;
  REF_BOOL pad_local;
  REF_INT version_local;
  REF_LONG nnode_local;
  REF_NODE ref_node_local;
  REF_LONG ncell_local;
  REF_CELL ref_cell_local;
  
  ncell_read = (REF_LONG)ref_node->ref_mpi;
  local_50 = -1;
  if (ncell / (long)((REF_MPI)ncell_read)->n < 1000000) {
    local_170 = 1000000;
  }
  else {
    local_170 = (int)(ncell / (long)((REF_MPI)ncell_read)->n);
  }
  elements_to_receive = local_170;
  section_size = ref_cell->node_per;
  cell = ref_cell->size_per;
  ref_mpi._0_4_ = pad;
  ref_mpi._4_4_ = version;
  _pad_local = nnode;
  nnode_local = (REF_LONG)ref_node;
  ref_node_local = (REF_NODE)ncell;
  ncell_local = (REF_LONG)ref_cell;
  if (cell * local_170 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x1b4,
           "ref_part_meshb_cell","malloc sent_c2n of REF_GLOB negative");
    ref_cell_local._4_4_ = 1;
  }
  else {
    dest = (REF_INT *)malloc((long)(cell * local_170) << 3);
    if (dest == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x1b4,
             "ref_part_meshb_cell","malloc sent_c2n of REF_GLOB NULL");
      ref_cell_local._4_4_ = 2;
    }
    else {
      if (*(int *)(ncell_read + 4) == 0) {
        if (*(int *)ncell_read < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1b7,"ref_part_meshb_cell","malloc elements_to_send of REF_INT negative");
          return 1;
        }
        start_to_send = (REF_INT *)malloc((long)*(int *)ncell_read << 2);
        if (start_to_send == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1b7,"ref_part_meshb_cell","malloc elements_to_send of REF_INT NULL");
          return 2;
        }
        if (*(int *)ncell_read < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1b8,"ref_part_meshb_cell","malloc start_to_send of REF_INT negative");
          return 1;
        }
        _size_per = (undefined4 *)malloc((long)*(int *)ncell_read << 2);
        if (_size_per == (undefined4 *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1b8,"ref_part_meshb_cell","malloc start_to_send of REF_INT NULL");
          return 2;
        }
        if (cell * elements_to_receive < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1b9,"ref_part_meshb_cell","malloc c2n of REF_GLOB negative");
          return 1;
        }
        c2n_int = (REF_INT *)malloc((long)(cell * elements_to_receive) << 3);
        if (c2n_int == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1b9,"ref_part_meshb_cell","malloc c2n of REF_GLOB NULL");
          return 2;
        }
        if ((section_size + 1) * elements_to_receive < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1ba,"ref_part_meshb_cell","malloc c2n_int of REF_INT negative");
          return 1;
        }
        c2n_long = (REF_LONG *)malloc((long)((section_size + 1) * elements_to_receive) << 2);
        if (c2n_long == (REF_LONG *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1ba,"ref_part_meshb_cell","malloc c2n_int of REF_INT NULL");
          return 2;
        }
        if ((section_size + 1) * elements_to_receive < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1bb,"ref_part_meshb_cell","malloc c2n_long of REF_LONG negative");
          return 1;
        }
        sent_c2n = (REF_GLOB *)malloc((long)((section_size + 1) * elements_to_receive) << 3);
        if (sent_c2n == (REF_GLOB *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1bb,"ref_part_meshb_cell","malloc c2n_long of REF_LONG NULL");
          return 2;
        }
        if (elements_to_receive < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1bc,"ref_part_meshb_cell","malloc dest of REF_INT negative");
          return 1;
        }
        sent_part = (REF_INT *)malloc((long)elements_to_receive << 2);
        if (sent_part == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x1bc,"ref_part_meshb_cell","malloc dest of REF_INT NULL");
          return 2;
        }
        _end_of_message = 0;
        while (_end_of_message < (long)ref_node_local) {
          if (elements_to_receive < (int)ref_node_local - (int)_end_of_message) {
            local_174 = elements_to_receive;
          }
          else {
            local_174 = (int)ref_node_local - (int)_end_of_message;
          }
          part = local_174;
          sVar6 = (size_t)(local_174 * (section_size + 1));
          sStack_c0 = sVar6;
          if ((REF_BOOL)ref_mpi == 0) {
            if (ref_mpi._4_4_ < 4) {
              sVar7 = fread(c2n_long,4,sVar6,(FILE *)file);
              if (sVar6 != sVar7) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x1d5,"ref_part_meshb_cell","int c2n",sVar6,sVar7);
                return 1;
              }
              for (node = 0; node < part; node = node + 1) {
                for (new_location = 0; new_location < cell; new_location = new_location + 1) {
                  *(long *)(c2n_int + (long)(new_location + cell * node) * 2) =
                       (long)*(int *)((long)c2n_long +
                                     (long)(new_location + (section_size + 1) * node) * 4);
                }
              }
            }
            else {
              sVar7 = fread(sent_c2n,8,sVar6,(FILE *)file);
              if (sVar6 != sVar7) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x1dc,"ref_part_meshb_cell","long c2n",sVar6,sVar7);
                return 1;
              }
              for (node = 0; node < part; node = node + 1) {
                for (new_location = 0; new_location < cell; new_location = new_location + 1) {
                  *(REF_GLOB *)(c2n_int + (long)(new_location + cell * node) * 2) =
                       sent_c2n[new_location + (section_size + 1) * node];
                }
              }
            }
          }
          else {
            for (node = 0; node < part; node = node + 1) {
              sVar6 = (size_t)section_size;
              sVar7 = fread((void *)((long)c2n_long + (long)((section_size + 1) * node) * 4),4,
                            (long)section_size,(FILE *)file);
              if (sVar6 != sVar7) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x1c8,"ref_part_meshb_cell","int c2n pad node",sVar6,sVar7);
                return 1;
              }
              sVar6 = fread((void *)((long)&ref_private_status_reis_ai + 4),4,1,(FILE *)file);
              if (sVar6 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x1c9,"ref_part_meshb_cell","int c2n pad zero",1,sVar6);
                return 1;
              }
              sVar6 = fread((void *)((long)c2n_long +
                                    (long)(section_size + (section_size + 1) * node) * 4),4,1,
                            (FILE *)file);
              if (sVar6 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x1cd,"ref_part_meshb_cell","int c2n pad tag",1,sVar6);
                return 1;
              }
            }
            for (node = 0; node < part; node = node + 1) {
              for (new_location = 0; new_location < cell; new_location = new_location + 1) {
                *(long *)(c2n_int + (long)(new_location + cell * node) * 2) =
                     (long)*(int *)((long)c2n_long +
                                   (long)(new_location + (section_size + 1) * node) * 4);
              }
            }
          }
          for (node = 0; node < part; node = node + 1) {
            for (new_location = 0; new_location < section_size; new_location = new_location + 1) {
              lVar8 = (long)(new_location + cell * node);
              *(long *)(c2n_int + lVar8 * 2) = *(long *)(c2n_int + lVar8 * 2) + -1;
            }
          }
          if (*(int *)ncell_local == 9) {
            for (node = 0; node < part; node = node + 1) {
              uVar1 = *(undefined8 *)(c2n_int + (long)(cell * node + 1) * 2);
              uVar2 = *(undefined8 *)(c2n_int + (long)(cell * node + 2) * 2);
              uVar3 = *(undefined8 *)(c2n_int + (long)(cell * node + 3) * 2);
              uVar4 = *(undefined8 *)(c2n_int + (long)(cell * node + 4) * 2);
              *(undefined8 *)(c2n_int + (long)(cell * node) * 2) =
                   *(undefined8 *)(c2n_int + (long)(cell * node) * 2);
              *(undefined8 *)(c2n_int + (long)(cell * node + 3) * 2) = uVar1;
              *(undefined8 *)(c2n_int + (long)(cell * node + 4) * 2) = uVar2;
              *(undefined8 *)(c2n_int + (long)(cell * node + 1) * 2) = uVar3;
              *(undefined8 *)(c2n_int + (long)(cell * node + 2) * 2) = uVar4;
            }
          }
          _end_of_message = part + _end_of_message;
          for (node = 0; node < part; node = node + 1) {
            if (*(long *)(c2n_int + (long)(cell * node) * 2) /
                ((_pad_local + *(int *)ncell_read + -1) / (long)*(int *)ncell_read) <
                _pad_local -
                (long)*(int *)ncell_read * ((_pad_local + -1) / (long)*(int *)ncell_read)) {
              local_198 = (int)(*(long *)(c2n_int + (long)(cell * node) * 2) /
                               ((_pad_local + *(int *)ncell_read + -1) / (long)*(int *)ncell_read));
            }
            else {
              local_198 = (int)((*(long *)(c2n_int + (long)(cell * node) * 2) -
                                (_pad_local -
                                (long)*(int *)ncell_read *
                                ((_pad_local + -1) / (long)*(int *)ncell_read)) *
                                ((_pad_local + *(int *)ncell_read + -1) / (long)*(int *)ncell_read))
                               / ((_pad_local + -1) / (long)*(int *)ncell_read)) +
                          ((int)_pad_local -
                          *(int *)ncell_read * (int)((_pad_local + -1) / (long)*(int *)ncell_read));
            }
            sent_part[node] = local_198;
          }
          for (ncell_keep = 0; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            start_to_send[ncell_keep] = 0;
          }
          for (node = 0; node < part; node = node + 1) {
            start_to_send[sent_part[node]] = start_to_send[sent_part[node]] + 1;
          }
          *_size_per = 0;
          for (ncell_keep = 1; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            _size_per[ncell_keep] = _size_per[ncell_keep + -1] + start_to_send[ncell_keep + -1];
          }
          for (ncell_keep = 0; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            start_to_send[ncell_keep] = 0;
          }
          for (node = 0; node < part; node = node + 1) {
            nread._0_4_ = _size_per[sent_part[node]] + start_to_send[sent_part[node]];
            for (new_location = 0; new_location < cell; new_location = new_location + 1) {
              *(undefined8 *)(dest + (long)(new_location + cell * (int)nread) * 2) =
                   *(undefined8 *)(c2n_int + (long)(new_location + cell * node) * 2);
            }
            start_to_send[sent_part[node]] = start_to_send[sent_part[node]] + 1;
          }
          nread._4_4_ = *start_to_send;
          if (0 < nread._4_4_) {
            if (cell * nread._4_4_ < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x215,"ref_part_meshb_cell","malloc sent_part of REF_INT negative");
              return 1;
            }
            elements_to_send = (REF_INT *)malloc((long)(cell * nread._4_4_) << 2);
            if (elements_to_send == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x215,"ref_part_meshb_cell","malloc sent_part of REF_INT NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < cell * nread._4_4_
                ; ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              elements_to_send[ref_private_macro_code_rss_1] = -1;
            }
            for (node = 0; node < nread._4_4_; node = node + 1) {
              for (new_location = 0; new_location < section_size; new_location = new_location + 1) {
                if (*(long *)(dest + (long)(new_location + cell * node) * 2) /
                    ((_pad_local + *(int *)ncell_read + -1) / (long)*(int *)ncell_read) <
                    _pad_local -
                    (long)*(int *)ncell_read * ((_pad_local + -1) / (long)*(int *)ncell_read)) {
                  local_1e8 = (int)(*(long *)(dest + (long)(new_location + cell * node) * 2) /
                                   ((_pad_local + *(int *)ncell_read + -1) /
                                   (long)*(int *)ncell_read));
                }
                else {
                  local_1e8 = (int)((*(long *)(dest + (long)(new_location + cell * node) * 2) -
                                    (_pad_local -
                                    (long)*(int *)ncell_read *
                                    ((_pad_local + -1) / (long)*(int *)ncell_read)) *
                                    ((_pad_local + *(int *)ncell_read + -1) /
                                    (long)*(int *)ncell_read)) /
                                   ((_pad_local + -1) / (long)*(int *)ncell_read)) +
                              ((int)_pad_local -
                              *(int *)ncell_read *
                              (int)((_pad_local + -1) / (long)*(int *)ncell_read));
                }
                elements_to_send[new_location + cell * node] = local_1e8;
              }
            }
            uVar5 = ref_cell_add_many_global
                              ((REF_CELL)ncell_local,(REF_NODE)nnode_local,nread._4_4_,
                               (REF_GLOB *)dest,elements_to_send,*(REF_INT *)(ncell_read + 4));
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x21e,"ref_part_meshb_cell",(ulong)uVar5,"glob");
              return uVar5;
            }
            if (elements_to_send != (REF_INT *)0x0) {
              free(elements_to_send);
            }
          }
          for (ncell_keep = 1; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
            if (0 < start_to_send[ncell_keep]) {
              uVar5 = ref_mpi_scatter_send
                                ((REF_MPI)ncell_read,start_to_send + ncell_keep,1,1,ncell_keep);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x227,"ref_part_meshb_cell",(ulong)uVar5,"send");
                return uVar5;
              }
              uVar5 = ref_mpi_scatter_send
                                ((REF_MPI)ncell_read,dest + (long)(cell * _size_per[ncell_keep]) * 2
                                 ,cell * start_to_send[ncell_keep],2,ncell_keep);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x22b,"ref_part_meshb_cell",(ulong)uVar5,"send");
                return uVar5;
              }
            }
          }
        }
        if (sent_part != (REF_INT *)0x0) {
          free(sent_part);
        }
        if (sent_c2n != (REF_GLOB *)0x0) {
          free(sent_c2n);
        }
        if (c2n_long != (REF_LONG *)0x0) {
          free(c2n_long);
        }
        if (c2n_int != (REF_INT *)0x0) {
          free(c2n_int);
        }
        if (_size_per != (undefined4 *)0x0) {
          free(_size_per);
        }
        if (start_to_send != (REF_INT *)0x0) {
          free(start_to_send);
        }
        for (ncell_keep = 1; ncell_keep < *(int *)ncell_read; ncell_keep = ncell_keep + 1) {
          uVar5 = ref_mpi_scatter_send((REF_MPI)ncell_read,&local_50,1,1,ncell_keep);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x23a,"ref_part_meshb_cell",(ulong)uVar5,"send");
            return uVar5;
          }
        }
      }
      else {
        do {
          uVar5 = ref_mpi_scatter_recv((REF_MPI)ncell_read,(void *)((long)&c2n + 4),1,1);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x23f,"ref_part_meshb_cell",(ulong)uVar5,"recv");
            return uVar5;
          }
          if (0 < c2n._4_4_) {
            uVar5 = ref_mpi_scatter_recv((REF_MPI)ncell_read,dest,cell * c2n._4_4_,2);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x243,"ref_part_meshb_cell",(ulong)uVar5,"send");
              return uVar5;
            }
            if (cell * c2n._4_4_ < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x246,"ref_part_meshb_cell","malloc sent_part of REF_INT negative");
              return 1;
            }
            elements_to_send = (REF_INT *)malloc((long)(cell * c2n._4_4_) << 2);
            if (elements_to_send == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x246,"ref_part_meshb_cell","malloc sent_part of REF_INT NULL");
              return 2;
            }
            for (ref_private_macro_code_rss_7 = 0; ref_private_macro_code_rss_7 < cell * c2n._4_4_;
                ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
              elements_to_send[ref_private_macro_code_rss_7] = -1;
            }
            for (node = 0; node < c2n._4_4_; node = node + 1) {
              for (new_location = 0; new_location < section_size; new_location = new_location + 1) {
                if (*(long *)(dest + (long)(new_location + cell * node) * 2) /
                    ((_pad_local + *(int *)ncell_read + -1) / (long)*(int *)ncell_read) <
                    _pad_local -
                    (long)*(int *)ncell_read * ((_pad_local + -1) / (long)*(int *)ncell_read)) {
                  local_238 = (int)(*(long *)(dest + (long)(new_location + cell * node) * 2) /
                                   ((_pad_local + *(int *)ncell_read + -1) /
                                   (long)*(int *)ncell_read));
                }
                else {
                  local_238 = (int)((*(long *)(dest + (long)(new_location + cell * node) * 2) -
                                    (_pad_local -
                                    (long)*(int *)ncell_read *
                                    ((_pad_local + -1) / (long)*(int *)ncell_read)) *
                                    ((_pad_local + *(int *)ncell_read + -1) /
                                    (long)*(int *)ncell_read)) /
                                   ((_pad_local + -1) / (long)*(int *)ncell_read)) +
                              ((int)_pad_local -
                              *(int *)ncell_read *
                              (int)((_pad_local + -1) / (long)*(int *)ncell_read));
                }
                elements_to_send[new_location + cell * node] = local_238;
              }
            }
            uVar5 = ref_cell_add_many_global
                              ((REF_CELL)ncell_local,(REF_NODE)nnode_local,c2n._4_4_,
                               (REF_GLOB *)dest,elements_to_send,*(REF_INT *)(ncell_read + 4));
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x250,"ref_part_meshb_cell",(ulong)uVar5,"many glob");
              return uVar5;
            }
            if (elements_to_send != (REF_INT *)0x0) {
              free(elements_to_send);
            }
          }
        } while (c2n._4_4_ != local_50);
      }
      free(dest);
      ref_cell_local._4_4_ = ref_migrate_shufflin_cell((REF_NODE)nnode_local,(REF_CELL)ncell_local);
      if (ref_cell_local._4_4_ == 0) {
        ref_cell_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x259,"ref_part_meshb_cell",(ulong)ref_cell_local._4_4_,"fill ghosts");
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell(REF_CELL ref_cell, REF_LONG ncell,
                                              REF_NODE ref_node, REF_LONG nnode,
                                              REF_INT version, REF_BOOL pad,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  node_per = ref_cell_node_per(ref_cell);
  size_per = ref_cell_size_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(c2n_int, (node_per + 1) * chunk, REF_INT);
    ref_malloc(c2n_long, (node_per + 1) * chunk, REF_LONG);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
      nread = (size_t)(section_size * (1 + node_per));
      if (pad) {
        for (cell = 0; cell < section_size; cell++) {
          REF_INT zero;
          REIS(node_per,
               fread(&(c2n_int[(node_per + 1) * cell]), sizeof(REF_INT),
                     (size_t)node_per, file),
               "int c2n pad node");
          REIS(1, fread(&(zero), sizeof(REF_INT), 1, file), "int c2n pad zero");
          REIS(1,
               fread(&(c2n_int[node_per + (node_per + 1) * cell]),
                     sizeof(REF_INT), 1, file),
               "int c2n pad tag");
        }
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        if (version < 4) {
          REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
        } else {
          REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file),
               "long c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
        }
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;

      if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
        REF_GLOB n0, n1, n2, n3, n4;
        /* convention: square basis is 0-1-2-3
           (oriented counter clockwise like trias) and top vertex is 4 */
        for (cell = 0; cell < section_size; cell++) {
          n0 = c2n[0 + size_per * cell];
          n1 = c2n[1 + size_per * cell];
          n2 = c2n[2 + size_per * cell];
          n3 = c2n[3 + size_per * cell];
          n4 = c2n[4 + size_per * cell];
          c2n[0 + size_per * cell] = n0;
          c2n[3 + size_per * cell] = n1;
          c2n[4 + size_per * cell] = n2;
          c2n[1 + size_per * cell] = n3;
          c2n[2 + size_per * cell] = n4;
        }
      }

      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      /* rank 0 keepers */

      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }

      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(c2n_long);
    ref_free(c2n_int);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (elements_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");

        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);

        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "many glob");

        ref_free(sent_part);
      }
    } while (elements_to_receive != end_of_message);
  }

  free(sent_c2n);

  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");

  return REF_SUCCESS;
}